

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

kvs_ops_stat * filemgr_get_ops_stats(filemgr *file,kvs_info *kvs)

{
  long lVar1;
  avl_node *paVar2;
  long in_RSI;
  long in_RDI;
  kvs_node *node;
  kvs_node query;
  avl_node *a;
  kvs_header *kv_header;
  kvs_ops_stat *stat;
  avl_node *in_stack_ffffffffffffff10;
  avl_tree *in_stack_ffffffffffffff18;
  kvs_ops_stat *local_20;
  kvs_ops_stat *local_8;
  
  local_20 = (kvs_ops_stat *)0x0;
  if ((in_RSI == 0) || ((in_RSI != 0 && (*(long *)(in_RSI + 8) == 0)))) {
    local_8 = (kvs_ops_stat *)(in_RDI + 0x70);
  }
  else {
    lVar1 = *(long *)(in_RDI + 0x170);
    pthread_spin_lock((pthread_spinlock_t *)(lVar1 + 0x38));
    paVar2 = avl_search(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                        *(avl_cmp_func **)(in_RSI + 8));
    if (paVar2 != (avl_node *)0x0) {
      local_20 = (kvs_ops_stat *)&paVar2[-6].left;
    }
    pthread_spin_unlock((pthread_spinlock_t *)(lVar1 + 0x38));
    local_8 = local_20;
  }
  return local_8;
}

Assistant:

struct kvs_ops_stat *filemgr_get_ops_stats(struct filemgr *file,
                                           struct kvs_info *kvs)
{
    struct kvs_ops_stat *stat = NULL;
    if (!kvs || (kvs && kvs->id == 0)) {
        return &file->header.op_stat;
    } else {
        struct kvs_header *kv_header = file->kv_header;
        struct avl_node *a;
        struct kvs_node query, *node;
        spin_lock(&kv_header->lock);
        query.id = kvs->id;
        a = avl_search(kv_header->idx_id, &query.avl_id, _kvs_stat_cmp);
        if (a) {
            node = _get_entry(a, struct kvs_node, avl_id);
            stat = &node->op_stat;
        }
        spin_unlock(&kv_header->lock);
    }
    return stat;
}